

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.cc
# Opt level: O0

void __thiscall
SDL2pp::Surface::BlitScaled
          (Surface *this,Optional<Rect> *srcrect,Surface *dst,Optional<Rect> *dstrect)

{
  SDL_Surface *pSVar1;
  bool bVar2;
  int iVar3;
  value_type *pvVar4;
  SDL_Surface *pSVar5;
  Exception *this_00;
  undefined8 *local_78;
  value_type *local_60;
  undefined8 local_38;
  SDL_Rect tmpdstrect;
  Optional<Rect> *dstrect_local;
  Surface *dst_local;
  Optional<Rect> *srcrect_local;
  Surface *this_local;
  
  tmpdstrect._8_8_ = dstrect;
  bVar2 = sdl2pp_libcpp_optional::optional::operator_cast_to_bool((optional *)dstrect);
  if (bVar2) {
    pvVar4 = sdl2pp_libcpp_optional::optional<SDL2pp::Rect>::operator*
                       ((optional<SDL2pp::Rect> *)tmpdstrect._8_8_);
    local_38._0_4_ = (pvVar4->super_SDL_Rect).x;
    local_38._4_4_ = (pvVar4->super_SDL_Rect).y;
    tmpdstrect.x = (pvVar4->super_SDL_Rect).w;
    tmpdstrect.y = (pvVar4->super_SDL_Rect).h;
  }
  pSVar1 = this->surface_;
  bVar2 = sdl2pp_libcpp_optional::optional::operator_cast_to_bool((optional *)srcrect);
  if (bVar2) {
    local_60 = sdl2pp_libcpp_optional::optional<SDL2pp::Rect>::operator*(srcrect);
  }
  else {
    local_60 = (value_type *)0x0;
  }
  pSVar5 = Get(dst);
  bVar2 = sdl2pp_libcpp_optional::optional::operator_cast_to_bool((optional *)tmpdstrect._8_8_);
  if (bVar2) {
    local_78 = &local_38;
  }
  else {
    local_78 = (undefined8 *)0x0;
  }
  iVar3 = SDL_UpperBlitScaled(pSVar1,local_60,pSVar5,local_78);
  if (iVar3 == 0) {
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x50);
  Exception::Exception(this_00,"SDL_BlitScaled");
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Surface::BlitScaled(const Optional<Rect>& srcrect, Surface& dst, const Optional<Rect>& dstrect) {
	SDL_Rect tmpdstrect; // 4th argument is non-const; does it modify rect?
	if (dstrect)
		tmpdstrect = *dstrect;
	if (SDL_BlitScaled(surface_, srcrect ? &*srcrect : nullptr, dst.Get(), dstrect ? &tmpdstrect : nullptr) != 0)
		throw Exception("SDL_BlitScaled");
}